

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O0

int I420Scale_16(uint16_t *src_y,int src_stride_y,uint16_t *src_u,int src_stride_u,uint16_t *src_v,
                int src_stride_v,int src_width,int src_height,uint16_t *dst_y,int dst_stride_y,
                uint16_t *dst_u,int dst_stride_u,uint16_t *dst_v,int dst_stride_v,int dst_width,
                int dst_height,FilterMode filtering)

{
  undefined4 in_ECX;
  long in_RDX;
  long in_RDI;
  long in_R8;
  int in_R9D;
  FilterMode unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000028;
  int dst_halfheight;
  int dst_halfwidth;
  int src_halfheight;
  int src_halfwidth;
  int in_stack_00000050;
  int local_54;
  int local_50;
  int local_4c;
  undefined4 in_stack_ffffffffffffffd8;
  int dst_width_00;
  int in_stack_fffffffffffffff8;
  int local_4;
  
  if (in_stack_00000010 < 0) {
    local_4c = -(1 - in_stack_00000010 >> 1);
  }
  else {
    local_4c = in_stack_00000010 + 1 >> 1;
  }
  if ((int)src_v < 0) {
    local_50 = -(1 - (int)src_v >> 1);
  }
  else {
    local_50 = (int)src_v + 1 >> 1;
  }
  if (in_stack_00000050 < 0) {
    local_54 = -(1 - in_stack_00000050 >> 1);
  }
  else {
    local_54 = in_stack_00000050 + 1 >> 1;
  }
  if (((((in_RDI == 0) || (in_RDX == 0)) || (in_R8 == 0)) ||
      ((((in_stack_00000008 == 0 || (in_stack_00000010 == 0)) ||
        ((0x8000 < in_stack_00000008 || ((0x8000 < in_stack_00000010 || (in_stack_00000018 == 0)))))
        ) || (in_stack_00000028 == 0)))) ||
     (((_dst_halfwidth == 0 || ((int)src_v < 1)) || (in_stack_00000050 < 1)))) {
    local_4 = -1;
  }
  else {
    ScalePlane_16((uint16_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),(int)((ulong)in_R8 >> 0x20)
                  ,(int)in_R8,in_R9D,(uint16_t *)CONCAT44(local_4c,local_50),local_54,(int)in_RDI,
                  in_stack_fffffffffffffff8,unaff_retaddr);
    dst_width_00 = (int)in_RDI;
    ScalePlane_16((uint16_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),(int)((ulong)in_R8 >> 0x20)
                  ,(int)in_R8,in_R9D,(uint16_t *)CONCAT44(local_4c,local_50),local_54,dst_width_00,
                  in_stack_fffffffffffffff8,unaff_retaddr);
    ScalePlane_16((uint16_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),(int)((ulong)in_R8 >> 0x20)
                  ,(int)in_R8,in_R9D,(uint16_t *)CONCAT44(local_4c,local_50),local_54,dst_width_00,
                  in_stack_fffffffffffffff8,unaff_retaddr);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int I420Scale_16(const uint16_t* src_y,
                 int src_stride_y,
                 const uint16_t* src_u,
                 int src_stride_u,
                 const uint16_t* src_v,
                 int src_stride_v,
                 int src_width,
                 int src_height,
                 uint16_t* dst_y,
                 int dst_stride_y,
                 uint16_t* dst_u,
                 int dst_stride_u,
                 uint16_t* dst_v,
                 int dst_stride_v,
                 int dst_width,
                 int dst_height,
                 enum FilterMode filtering) {
  int src_halfwidth = SUBSAMPLE(src_width, 1, 1);
  int src_halfheight = SUBSAMPLE(src_height, 1, 1);
  int dst_halfwidth = SUBSAMPLE(dst_width, 1, 1);
  int dst_halfheight = SUBSAMPLE(dst_height, 1, 1);
  if (!src_y || !src_u || !src_v || src_width == 0 || src_height == 0 ||
      src_width > 32768 || src_height > 32768 || !dst_y || !dst_u || !dst_v ||
      dst_width <= 0 || dst_height <= 0) {
    return -1;
  }

  ScalePlane_16(src_y, src_stride_y, src_width, src_height, dst_y, dst_stride_y,
                dst_width, dst_height, filtering);
  ScalePlane_16(src_u, src_stride_u, src_halfwidth, src_halfheight, dst_u,
                dst_stride_u, dst_halfwidth, dst_halfheight, filtering);
  ScalePlane_16(src_v, src_stride_v, src_halfwidth, src_halfheight, dst_v,
                dst_stride_v, dst_halfwidth, dst_halfheight, filtering);
  return 0;
}